

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O0

bool google::protobuf::internal::ParseAnyTypeUrl
               (string *type_url,string *url_prefix,string *full_type_name)

{
  long lVar1;
  long lVar2;
  string *in_RDX;
  string *in_RSI;
  char *in_RDI;
  size_t pos;
  string local_68 [32];
  string local_48 [32];
  long local_28;
  string *local_20;
  string *local_18;
  char *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = std::__cxx11::string::find_last_of(in_RDI,0x838c85);
  if ((local_28 != -1) &&
     (lVar1 = local_28 + 1, lVar2 = std::__cxx11::string::size(), lVar1 != lVar2)) {
    if (local_18 != (string *)0x0) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)local_10);
      std::__cxx11::string::operator=(local_18,local_48);
      std::__cxx11::string::~string(local_48);
    }
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_10);
    std::__cxx11::string::operator=(local_20,local_68);
    std::__cxx11::string::~string(local_68);
    return true;
  }
  return false;
}

Assistant:

bool ParseAnyTypeUrl(const std::string& type_url, std::string* url_prefix,
                     std::string* full_type_name) {
  size_t pos = type_url.find_last_of("/");
  if (pos == std::string::npos || pos + 1 == type_url.size()) {
    return false;
  }
  if (url_prefix) {
    *url_prefix = type_url.substr(0, pos + 1);
  }
  *full_type_name = type_url.substr(pos + 1);
  return true;
}